

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfTiledInputSetFrameBuffer(ImfTiledInputFile *in,ImfRgba *base,size_t xStride,size_t yStride)

{
  Imf_3_4::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)in,(Rgba *)base,xStride,yStride)
  ;
  return 1;
}

Assistant:

int
ImfTiledInputSetFrameBuffer (
    ImfTiledInputFile* in, ImfRgba* base, size_t xStride, size_t yStride)
{
    try
    {
        infile (in)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}